

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

ActionObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::CreateActionObservationHistoryTree
          (PlanningUnitMADPDiscrete *this,Index agentI)

{
  long lVar1;
  int iVar2;
  Index IVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ActionObservationHistory *pAVar5;
  ActionObservationHistoryTree *pAVar6;
  size_type sVar7;
  ostream *poVar8;
  ActionObservationHistory *this_00;
  ulong uVar9;
  uint uVar10;
  uint local_c4;
  ActionObservationHistoryTree *aoht;
  long local_b0;
  ActionObservationHistoryTree *next_aoht;
  ActionObservationHistoryTree *local_a0;
  size_t local_98;
  ulong local_90;
  ActionObservationHistoryTree *root;
  queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
  aohtQueue;
  
  std::
  queue<ActionObservationHistoryTree*,std::deque<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>>>
  ::
  queue<std::deque<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>>,void>
            (&aohtQueue);
  local_98 = (this->super_PlanningUnit)._m_horizon;
  iVar2 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,(ulong)agentI);
  local_90 = CONCAT44(extraout_var,iVar2);
  uVar4 = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,agentI);
  pAVar5 = (ActionObservationHistory *)operator_new(0x30);
  ActionObservationHistory::ActionObservationHistory(pAVar5,this,agentI);
  pAVar6 = (ActionObservationHistoryTree *)operator_new(0x60);
  ActionObservationHistoryTree::ActionObservationHistoryTree(pAVar6,pAVar5,A_SUC);
  root = pAVar6;
  std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>::
  push_back(&aohtQueue.c,&root);
  local_b0 = (ulong)agentI * 0x18;
  aoht = (ActionObservationHistoryTree *)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
  emplace_back<unsigned_long_long>
            ((this->_m_firstAOHIforT).
             super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + agentI,(unsigned_long_long *)&aoht);
  local_98 = local_98 - 1;
  pAVar6 = (ActionObservationHistoryTree *)0x0;
  local_c4 = 0;
  while( true ) {
    sVar7 = std::
            deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>::
            size(&aohtQueue.c);
    lVar1 = local_b0;
    if (sVar7 == 0) break;
    aoht = *aohtQueue.c.
            super__Deque_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_a0 = pAVar6;
    pAVar5 = ActionObservationHistoryTree::GetActionObservationHistory(aoht);
    std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>::
    pop_front(&aohtQueue.c);
    uVar10 = (uint)(pAVar5->super_IndividualHistory).super_History._m_length;
    if (local_c4 != uVar10) {
      IVar3 = Globals::CastLIndexToIndex
                        (*(LIndex *)
                          (*(long *)((long)&(((this->_m_firstAOHIforT).
                                              super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                            )._M_impl.super__Vector_impl_data._M_start + local_b0) +
                          (ulong)local_c4 * 8));
      next_aoht = (ActionObservationHistoryTree *)(ulong)((int)local_a0 - IVar3);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((this->_m_nrActionObservationHistoriesT).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + local_b0),(unsigned_long *)&next_aoht);
      local_c4 = local_c4 + 1;
      if (local_c4 != uVar10) {
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "ERROR: CreateActionObservationHistories:  ++ts != ");
        poVar8 = std::operator<<(poVar8,"(Index) thisLength !!! ts (now) is: ");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8,"thisLength-1  =");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,uVar10 - 1);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      next_aoht = pAVar6;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
      emplace_back<unsigned_long_long>
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 ((long)&(((this->_m_firstAOHIforT).
                           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_b0),
                 (unsigned_long_long *)&next_aoht);
    }
    ActionObservationHistoryTree::SetIndex(aoht,(Index)local_a0);
    std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>::
    push_back((vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
               *)((long)&(((this->_m_actionObservationHistoryTreeVectors).
                           super__Vector_base<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>,_std::allocator<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_b0),&aoht);
    if ((pAVar5->super_IndividualHistory).super_History._m_length < local_98) {
      for (uVar10 = 0; uVar10 < local_90; uVar10 = uVar10 + 1) {
        uVar9 = 0;
        while (IVar3 = (Index)uVar9, uVar9 < uVar4) {
          this_00 = (ActionObservationHistory *)operator_new(0x30);
          ActionObservationHistory::ActionObservationHistory(this_00,uVar10,IVar3,pAVar5);
          pAVar6 = (ActionObservationHistoryTree *)operator_new(0x60);
          ActionObservationHistoryTree::ActionObservationHistoryTree(pAVar6,this_00,A_SUC);
          next_aoht = pAVar6;
          ActionObservationHistoryTree::SetSuccessor(aoht,uVar10,IVar3,pAVar6);
          std::
          deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>::
          push_back(&aohtQueue.c,&next_aoht);
          uVar9 = (ulong)(IVar3 + 1);
        }
      }
    }
    pAVar6 = (ActionObservationHistoryTree *)(ulong)((int)local_a0 + 1);
  }
  IVar3 = Globals::CastLIndexToIndex
                    (*(LIndex *)
                      (*(long *)((long)&(((this->_m_firstAOHIforT).
                                          super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + local_b0) +
                      (ulong)local_c4 * 8));
  aoht = (ActionObservationHistoryTree *)(ulong)((int)pAVar6 - IVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&(((this->_m_nrActionObservationHistoriesT).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar1),(unsigned_long *)&aoht);
  aoht = pAVar6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->_m_nrActionObservationHistories,(unsigned_long *)&aoht);
  pAVar6 = root;
  std::_Deque_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
  ::~_Deque_base((_Deque_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
                  *)&aohtQueue);
  return pAVar6;
}

Assistant:

ActionObservationHistoryTree* PlanningUnitMADPDiscrete::
    CreateActionObservationHistoryTree(Index agentI)
{
    queue<ActionObservationHistoryTree*> aohtQueue;
    
    Index aohI = 0;
    size_t maxLength = GetHorizon() - 1;
    size_t nrA = GetNrActions(agentI);
    size_t nrO = GetNrObservations(agentI);

    //initial ActionObservationHistory aoh_0
    ActionObservationHistory* aoh_0 =new ActionObservationHistory(*this,agentI);
    ActionObservationHistoryTree* root =new ActionObservationHistoryTree(aoh_0);

    aohtQueue.push(root);

    Index ts = 0;
    _m_firstAOHIforT[agentI].push_back(aohI);
    while(aohtQueue.size() >= 1)
    {
        //  aoh = queue.pop
        ActionObservationHistoryTree* aoht = aohtQueue.front();
        ActionObservationHistory* aoh = aoht->GetActionObservationHistory();
        aohtQueue.pop();

        int thisLength = aoh->GetLength(); 
        if(ts != (Index) thisLength  ) //length 0 <-> ts 0 
        {
            // we've now started processing AOHs for the next ts
            Index nr_AOHI_for_ts = aohI - 
                CastLIndexToIndex(_m_firstAOHIforT[agentI][ts]);
#if DEBUG_PUDCAOHT
            cout << "First aoh for next ts+1: store nr of ts-OH..."<<endl<<
                "_m_firstAOHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
                _m_firstAOHIforT[agentI][ts] << ", current AOHI = " <<
                aohI << endl;
            Index tempIndex = _m_nrActionHistoriesT[agentI].size();
#endif                
            _m_nrActionObservationHistoriesT[agentI].push_back(nr_AOHI_for_ts); 
#if DEBUG_PUDCAOHT
            cout << 
                "Set _m_nrActionObservationHistoriesT[agentI="<<agentI<<"][t="<<
                tempIndex <<" (ts="<<ts<<")] = "<< nr_AOHI_for_ts <<endl;
#endif
            if(++ts != (Index) thisLength)
                cerr << "ERROR: CreateActionObservationHistories:  ++ts != "<<
                    "(Index) thisLength !!! ts (now) is: "<<ts<<
                    "thisLength-1  =" << thisLength-1 <<endl;            
            _m_firstAOHIforT[agentI].push_back(aohI);            
        }
        //  aoh.SetIndex(index++)
        aoht->SetIndex(aohI++);        
        _m_actionObservationHistoryTreeVectors[agentI].push_back(aoht);
        
        if(aoh->GetLength() >= maxLength )
            //this is a final action-obs history:
            continue;
        //else

        for(Index aI = 0; aI < nrA; aI++)
            for(Index oI = 0; oI < nrO; oI++)
            {
                //Constructor gets act. and obs. history and extends them
                //with aI, oI. to find new ones,
                ActionObservationHistory* next_aoh =
                    new ActionObservationHistory(aI, oI, aoh);
#if DEBUG_PUDCAOHT
                cout << "created new aoh (for aI="<<aI<<", oI="<<oI<<":"<<
                    endl; 
                next_aoh->Print();
                cout << endl;
#endif

                ActionObservationHistoryTree* next_aoht =
                    new ActionObservationHistoryTree(next_aoh);
#if DEBUG_PUDCAOHT
                cout << "\ncreated new aoh tree:"<<endl; 
                next_aoht->Print();
                cout << endl;
#endif

                aoht->SetSuccessor(aI, oI, next_aoht);
                aohtQueue.push(next_aoht);
            }

    }
    Index nr_AOHI_for_ts = aohI - CastLIndexToIndex(_m_firstAOHIforT[agentI][ts]);
    _m_nrActionObservationHistoriesT[agentI].push_back(nr_AOHI_for_ts);
    _m_nrActionObservationHistories.push_back(aohI);

    return(root);
}